

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__write(uv_stream_t *stream)

{
  uv__queue *puVar1;
  uv__queue *puVar2;
  uint uVar3;
  uv__queue *puVar4;
  int iVar5;
  uv__queue *puVar6;
  int iVar7;
  uv__queue *puVar8;
  bool bVar9;
  
  if ((stream->io_watcher).fd < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                  ,0x34d,"void uv__write(uv_stream_t *)");
  }
  iVar7 = 0x20;
  do {
    while( true ) {
      puVar1 = (stream->write_queue).next;
      if (puVar1 == &stream->write_queue) {
        return;
      }
      if ((uv_stream_t *)puVar1[-1].prev != stream) {
        __assert_fail("req->handle == stream",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x35b,"void uv__write(uv_stream_t *)");
      }
      uVar3 = uv__try_write(stream,(uv_buf_t *)(puVar1[1].prev + *(uint *)&puVar1[1].next),
                            *(int *)&puVar1[2].next - *(uint *)&puVar1[1].next,
                            (uv_stream_t *)puVar1[-1].next);
      if (-1 < (int)uVar3) break;
      if (uVar3 != 0xfffffff5) {
        *(uint *)((long)&puVar1[2].next + 4) = uVar3;
        uv__write_req_finish((uv_write_t *)(puVar1 + -6));
        uv__io_stop(stream->loop,&stream->io_watcher,4);
        return;
      }
LAB_00120d35:
      if ((stream->flags & 0x100000) == 0) {
        uv__io_start(stream->loop,&stream->io_watcher,4);
        return;
      }
    }
    puVar4 = (uv__queue *)(ulong)uVar3;
    puVar1[-1].next = (uv__queue *)0x0;
    if ((uv__queue *)stream->write_queue_size < puVar4) {
      __assert_fail("n <= stream->write_queue_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                    ,0x2b6,"int uv__write_req_update(uv_stream_t *, uv_write_t *, size_t)");
    }
    stream->write_queue_size = (long)stream->write_queue_size - (long)puVar4;
    puVar6 = puVar1[1].prev + *(uint *)&puVar1[1].next;
    do {
      puVar2 = puVar6->prev;
      puVar8 = puVar2;
      if (puVar4 < puVar2) {
        puVar8 = puVar4;
      }
      puVar6->next = (uv__queue *)((long)&puVar8->next + (long)puVar6->next);
      puVar6->prev = (uv__queue *)((long)puVar2 - (long)puVar8);
      puVar6 = puVar6 + (puVar2 <= puVar4);
      puVar4 = (uv__queue *)((long)puVar4 - (long)puVar8);
    } while (puVar4 != (uv__queue *)0x0);
    iVar5 = (int)((ulong)((long)puVar6 - (long)puVar1[1].prev) >> 4);
    *(int *)&puVar1[1].next = iVar5;
    if (*(int *)&puVar1[2].next != iVar5) goto LAB_00120d35;
    uv__write_req_finish((uv_write_t *)(puVar1 + -6));
    bVar9 = iVar7 == 0;
    iVar7 = iVar7 + -1;
    if (bVar9) {
      return;
    }
  } while( true );
}

Assistant:

static void uv__write(uv_stream_t* stream) {
  struct uv__queue* q;
  uv_write_t* req;
  ssize_t n;
  int count;

  assert(uv__stream_fd(stream) >= 0);

  /* Prevent loop starvation when the consumer of this stream read as fast as
   * (or faster than) we can write it. This `count` mechanism does not need to
   * change even if we switch to edge-triggered I/O.
   */
  count = 32;

  for (;;) {
    if (uv__queue_empty(&stream->write_queue))
      return;

    q = uv__queue_head(&stream->write_queue);
    req = uv__queue_data(q, uv_write_t, queue);
    assert(req->handle == stream);

    n = uv__try_write(stream,
                      &(req->bufs[req->write_index]),
                      req->nbufs - req->write_index,
                      req->send_handle);

    /* Ensure the handle isn't sent again in case this is a partial write. */
    if (n >= 0) {
      req->send_handle = NULL;
      if (uv__write_req_update(stream, req, n)) {
        uv__write_req_finish(req);
        if (count-- > 0)
          continue; /* Start trying to write the next request. */

        return;
      }
    } else if (n != UV_EAGAIN)
      goto error;

    /* If this is a blocking stream, try again. */
    if (stream->flags & UV_HANDLE_BLOCKING_WRITES)
      continue;

    /* We're not done. */
    uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);

    /* Notify select() thread about state change */
    uv__stream_osx_interrupt_select(stream);

    return;
  }

error:
  req->error = n;
  uv__write_req_finish(req);
  uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
  uv__stream_osx_interrupt_select(stream);
}